

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O0

void __thiscall wallet::WalletDatabase::WalletDatabase(WalletDatabase *this)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  atomic<int> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__WalletDatabase_01616848;
  std::atomic<int>::atomic(in_stack_ffffffffffffffd8,0);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)in_stack_ffffffffffffffd8,0);
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  in_RDI[3] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

WalletDatabase() : nUpdateCounter(0) {}